

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_tt_FindGlyphIndex(nk_tt_fontinfo *info,int unicode_codepoint)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ushort uVar4;
  uint uVar5;
  uint in_EDX;
  uint uVar6;
  int iVar7;
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar2 = (ulong)(uint)unicode_codepoint;
  uVar4 = *(ushort *)((long)&info->data + uVar2);
  uVar9 = uVar4 << 8;
  uVar4 = uVar4 >> 8;
  uVar8 = uVar9 | uVar4;
  switch(uVar8) {
  case 0:
    uVar4 = *(ushort *)((long)&info->data + uVar2 + 2);
    if ((int)in_EDX < (int)((ushort)(uVar4 << 8 | uVar4 >> 8) - 6)) {
      return (uint)*(byte *)((long)&info->data + (long)(int)in_EDX + uVar2 + 6);
    }
    break;
  default:
    if ((uVar9 | uVar4 & 0xfffe) != 0xc) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x2ba4,"int nk_tt_FindGlyphIndex(const struct nk_tt_fontinfo *, int)");
    }
    uVar5 = *(uint *)((long)&info->numGlyphs + uVar2);
    uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    if (0 < (int)uVar5) {
      iVar7 = 0;
      do {
        uVar6 = ((int)(uVar5 - iVar7) >> 1) + iVar7;
        lVar3 = (long)(int)uVar6 * 0xc;
        uVar10 = *(uint *)((long)&info->loca + lVar3 + uVar2);
        uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
        ;
        if (uVar10 <= in_EDX) {
          uVar1 = *(uint *)((long)&info->head + lVar3 + uVar2);
          if (in_EDX <= (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        uVar1 << 0x18)) {
            uVar5 = *(uint *)((long)&info->glyf + lVar3 + uVar2);
            iVar7 = 0;
            if (uVar8 == 0xc) {
              iVar7 = in_EDX - uVar10;
            }
            return iVar7 + (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                           uVar5 << 0x18);
          }
          iVar7 = uVar6 + 1;
          uVar6 = uVar5;
        }
        uVar5 = uVar6;
      } while (iVar7 < (int)uVar5);
    }
    break;
  case 2:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x2b5d,"int nk_tt_FindGlyphIndex(const struct nk_tt_fontinfo *, int)");
  case 4:
    if ((int)in_EDX < 0x10000) {
      uVar4 = *(ushort *)((long)&info->fontstart + uVar2 + 2);
      uVar9 = uVar4 << 8 | uVar4 >> 8;
      uVar11 = (ulong)(*(byte *)((long)&info->numGlyphs + uVar2 + 1) & 0xfffffffe) |
               (ulong)*(byte *)((long)&info->numGlyphs + uVar2) << 8;
      uVar4 = *(ushort *)((long)&info->data + uVar11 + (unicode_codepoint + 0xeU));
      iVar7 = (int)uVar11;
      if ((int)in_EDX < (int)(uint)(ushort)(uVar4 << 8 | uVar4 >> 8)) {
        iVar7 = 0;
      }
      uVar5 = iVar7 + unicode_codepoint + 0xc;
      if (uVar9 != 0) {
        uVar4 = *(ushort *)((long)&info->fontstart + uVar2);
        uVar10 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
        do {
          uVar10 = uVar10 >> 1;
          uVar6 = uVar10 & 0xfffffffe;
          uVar4 = *(ushort *)((long)&info->data + (ulong)uVar6 + (ulong)uVar5);
          if ((int)in_EDX <= (int)(uint)(ushort)(uVar4 << 8 | uVar4 >> 8)) {
            uVar6 = 0;
          }
          uVar5 = uVar6 + uVar5;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      uVar11 = (ulong)((uVar5 - unicode_codepoint) + 0x1fff4 & 0x1fffe);
      uVar4 = *(ushort *)((long)&info->data + uVar11 + (unicode_codepoint + 0xeU));
      if ((int)in_EDX <= (int)(uint)(ushort)(uVar4 << 8 | uVar4 >> 8)) {
        uVar4 = *(ushort *)((long)&info->data + uVar2 + 6);
        uVar9 = uVar4 << 8 | uVar4 >> 8;
        uVar4 = *(ushort *)((long)&info->loca + uVar11 + (uVar9 & 0xfffffffe) + uVar2);
        uVar5 = 0;
        uVar10 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
        if ((int)uVar10 <= (int)in_EDX) {
          uVar9 = uVar9 >> 1;
          lVar3 = (ulong)((uint)uVar9 + (uint)uVar9) * 3;
          uVar4 = *(ushort *)((long)&info->loca + uVar11 + lVar3 + uVar2 + 0xe + -0xe);
          uVar4 = uVar4 << 8 | uVar4 >> 8;
          if (uVar4 == 0) {
            uVar4 = *(ushort *)((long)&info->loca + uVar11 + (ulong)uVar9 * 4 + uVar2 + 0xe + -0xe);
            uVar5 = (ushort)(uVar4 << 8 | uVar4 >> 8) + in_EDX;
          }
          else {
            uVar4 = *(ushort *)
                     ((long)&info->loca +
                     uVar11 + (long)(int)((in_EDX - uVar10) * 2) + lVar3 + uVar2 + uVar4);
            uVar5 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
          }
        }
        return uVar5 & 0xffff;
      }
      __assert_fail("unicode_codepoint <= nk_ttUSHORT(data + endCount + 2*item)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x2b81,"int nk_tt_FindGlyphIndex(const struct nk_tt_fontinfo *, int)");
    }
    break;
  case 6:
    uVar4 = *(ushort *)((long)&info->data + uVar2 + 6);
    uVar4 = uVar4 << 8 | uVar4 >> 8;
    if (in_EDX < uVar4) {
      return 0;
    }
    uVar9 = *(ushort *)((long)&info->fontstart + uVar2);
    if ((uint)(ushort)(uVar9 << 8 | uVar9 >> 8) + (uint)uVar4 <= in_EDX) {
      return 0;
    }
    uVar4 = *(ushort *)((long)&info->fontstart + (long)(int)(in_EDX - uVar4) * 2 + uVar2 + 2);
    return (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
  }
  return 0;
}

Assistant:

NK_INTERN int
nk_tt_FindGlyphIndex(const struct nk_tt_fontinfo *info, int unicode_codepoint)
{
    const nk_byte *data = info->data;
    nk_uint index_map = (nk_uint)info->index_map;

    nk_ushort format = nk_ttUSHORT(data + index_map + 0);
    if (format == 0) { /* apple byte encoding */
        nk_int bytes = nk_ttUSHORT(data + index_map + 2);
        if (unicode_codepoint < bytes-6)
            return nk_ttBYTE(data + index_map + 6 + unicode_codepoint);
        return 0;
    } else if (format == 6) {
        nk_uint first = nk_ttUSHORT(data + index_map + 6);
        nk_uint count = nk_ttUSHORT(data + index_map + 8);
        if ((nk_uint) unicode_codepoint >= first && (nk_uint) unicode_codepoint < first+count)
            return nk_ttUSHORT(data + index_map + 10 + (unicode_codepoint - (int)first)*2);
        return 0;
    } else if (format == 2) {
        NK_ASSERT(0); /* @TODO: high-byte mapping for japanese/chinese/korean */
        return 0;
    } else if (format == 4) { /* standard mapping for windows fonts: binary search collection of ranges */
        nk_ushort segcount = nk_ttUSHORT(data+index_map+6) >> 1;
        nk_ushort searchRange = nk_ttUSHORT(data+index_map+8) >> 1;
        nk_ushort entrySelector = nk_ttUSHORT(data+index_map+10);
        nk_ushort rangeShift = nk_ttUSHORT(data+index_map+12) >> 1;

        /* do a binary search of the segments */
        nk_uint endCount = index_map + 14;
        nk_uint search = endCount;

        if (unicode_codepoint > 0xffff)
            return 0;

        /* they lie from endCount .. endCount + segCount */
        /* but searchRange is the nearest power of two, so... */
        if (unicode_codepoint >= nk_ttUSHORT(data + search + rangeShift*2))
            search += (nk_uint)(rangeShift*2);

        /* now decrement to bias correctly to find smallest */
        search -= 2;
        while (entrySelector) {
            nk_ushort end;
            searchRange >>= 1;
            end = nk_ttUSHORT(data + search + searchRange*2);
            if (unicode_codepoint > end)
                search += (nk_uint)(searchRange*2);
            --entrySelector;
        }
        search += 2;

      {
         nk_ushort offset, start;
         nk_ushort item = (nk_ushort) ((search - endCount) >> 1);

         NK_ASSERT(unicode_codepoint <= nk_ttUSHORT(data + endCount + 2*item));
         start = nk_ttUSHORT(data + index_map + 14 + segcount*2 + 2 + 2*item);
         if (unicode_codepoint < start)
            return 0;

         offset = nk_ttUSHORT(data + index_map + 14 + segcount*6 + 2 + 2*item);
         if (offset == 0)
            return (nk_ushort) (unicode_codepoint + nk_ttSHORT(data + index_map + 14 + segcount*4 + 2 + 2*item));

         return nk_ttUSHORT(data + offset + (unicode_codepoint-start)*2 + index_map + 14 + segcount*6 + 2 + 2*item);
      }
   } else if (format == 12 || format == 13) {
        nk_uint ngroups = nk_ttULONG(data+index_map+12);
        nk_int low,high;
        low = 0; high = (nk_int)ngroups;
        /* Binary search the right group. */
        while (low < high) {
            nk_int mid = low + ((high-low) >> 1); /* rounds down, so low <= mid < high */
            nk_uint start_char = nk_ttULONG(data+index_map+16+mid*12);
            nk_uint end_char = nk_ttULONG(data+index_map+16+mid*12+4);
            if ((nk_uint) unicode_codepoint < start_char)
                high = mid;
            else if ((nk_uint) unicode_codepoint > end_char)
                low = mid+1;
            else {
                nk_uint start_glyph = nk_ttULONG(data+index_map+16+mid*12+8);
                if (format == 12)
                    return (int)start_glyph + (int)unicode_codepoint - (int)start_char;
                else /* format == 13 */
                    return (int)start_glyph;
            }
        }
        return 0; /* not found */
    }
    /* @TODO */
    NK_ASSERT(0);
    return 0;
}